

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_move_to_last(nk_text_edit *state)

{
  int iVar1;
  int iVar2;
  int temp;
  
  iVar1 = state->select_start;
  iVar2 = state->select_end;
  if (iVar1 != iVar2) {
    if (iVar2 < iVar1) {
      state->select_end = iVar1;
      state->select_start = iVar2;
    }
    nk_textedit_clamp(state);
    state->cursor = state->select_end;
    state->select_start = state->select_end;
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_move_to_last(struct nk_text_edit *state)
{
/* move cursor to last character of selection */
if (NK_TEXT_HAS_SELECTION(state)) {
nk_textedit_sortselection(state);
nk_textedit_clamp(state);
state->cursor = state->select_end;
state->select_start = state->select_end;
state->has_preferred_x = 0;
}
}